

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O3

void __thiscall cab::update_position(cab *this,node_type position)

{
  node_type nVar1;
  uint32_t uVar2;
  pointer prVar3;
  pointer prVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  cab_manager::update_cab(this->_cab_manager,this->_id,this->_position,position);
  this->_position = position;
  prVar4 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
      super__Vector_impl_data._M_finish != prVar4) {
    lVar7 = -0x10;
    lVar5 = 0;
    uVar6 = 0;
    do {
      nVar1 = request::src((request *)(&prVar4->_src + lVar5));
      if (nVar1 == position) {
        uVar2 = request::passengers((request *)
                                    (&((this->_requests).
                                       super__Vector_base<request,_std::allocator<request>_>._M_impl
                                       .super__Vector_impl_data._M_start)->_src + lVar5));
        this->_passengers = this->_passengers + uVar2;
        request::pick_up((request *)
                         (&((this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                            _M_impl.super__Vector_impl_data._M_start)->_src + lVar5));
      }
      nVar1 = request::dst((request *)
                           (&((this->_requests).
                              super__Vector_base<request,_std::allocator<request>_>._M_impl.
                              super__Vector_impl_data._M_start)->_src + lVar5));
      if (nVar1 == position) {
        uVar2 = request::passengers((request *)
                                    (&((this->_requests).
                                       super__Vector_base<request,_std::allocator<request>_>._M_impl
                                       .super__Vector_impl_data._M_start)->_src + lVar5));
        this->_passengers = this->_passengers - uVar2;
        prVar4 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                 super__Vector_impl_data._M_start;
        prVar3 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((pointer)(&prVar4[1]._src + lVar5) != prVar3) {
          memmove(&prVar4->_src + lVar5,(pointer)(&prVar4[1]._src + lVar5),
                  (size_t)((long)prVar3 + (lVar7 - (long)prVar4)));
          prVar3 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        prVar3 = prVar3 + -1;
        (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
        super__Vector_impl_data._M_finish = prVar3;
      }
      else {
        prVar3 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
      prVar4 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
      lVar7 = lVar7 + -0x10;
    } while (uVar6 < (ulong)((long)prVar3 - (long)prVar4 >> 4));
  }
  return;
}

Assistant:

void cab::update_position(node_type position)
{
    _cab_manager->update_cab(_id, _position, position);
    _position = position;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == position)
        {
            _passengers += _requests[i].passengers();
            _requests[i].pick_up();
        }

        if(_requests[i].dst() == position)
        {
            _passengers -= _requests[i].passengers();
            _requests.erase(_requests.begin() + i);
        }
    }
}